

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

png_int_32 png_get_int_32(png_const_bytep buf)

{
  uint uVar1;
  png_uint_32 uval;
  png_const_bytep buf_local;
  
  buf_local._4_4_ =
       (uint)*buf * 0x1000000 + (uint)buf[1] * 0x10000 + (uint)buf[2] * 0x100 + (uint)buf[3];
  if ((buf_local._4_4_ & 0x80000000) != 0) {
    uVar1 = (buf_local._4_4_ ^ 0xffffffff) + 1;
    if ((uVar1 & 0x80000000) == 0) {
      buf_local._4_4_ = -uVar1;
    }
    else {
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

png_int_32 (PNGAPI
png_get_int_32)(png_const_bytep buf)
{
   png_uint_32 uval = png_get_uint_32(buf);
   if ((uval & 0x80000000) == 0) /* non-negative */
      return (png_int_32)uval;

   uval = (uval ^ 0xffffffff) + 1;  /* 2's complement: -x = ~x+1 */
   if ((uval & 0x80000000) == 0) /* no overflow */
      return -(png_int_32)uval;
   /* The following has to be safe; this function only gets called on PNG data
    * and if we get here that data is invalid.  0 is the most safe value and
    * if not then an attacker would surely just generate a PNG with 0 instead.
    */
   return 0;
}